

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetResMonParams(void *kinmem,realtype omegamin,realtype omegamax)

{
  KINMem kin_mem;
  realtype omegamax_local;
  realtype omegamin_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetResMonParams","kinsol_mem = NULL illegal.");
    kinmem_local._4_4_ = -1;
  }
  else if (0.0 <= omegamin) {
    if ((omegamin != 0.0) || (NAN(omegamin))) {
      *(realtype *)((long)kinmem + 0x238) = omegamin;
    }
    else {
      *(undefined8 *)((long)kinmem + 0x238) = 0x3ee4f8b588e368f1;
    }
    if (0.0 <= omegamax) {
      if ((omegamax != 0.0) || (NAN(omegamax))) {
        if (omegamax < *(double *)((long)kinmem + 0x238)) {
          KINProcessError((KINMem)0x0,-2,"KINSOL","KINSetResMonParams","scalars < 0 illegal.");
          return -2;
        }
        *(realtype *)((long)kinmem + 0x240) = omegamax;
      }
      else {
        if (0.9 < *(double *)((long)kinmem + 0x238)) {
          KINProcessError((KINMem)0x0,-2,"KINSOL","KINSetResMonParams","scalars < 0 illegal.");
          return -2;
        }
        *(undefined8 *)((long)kinmem + 0x240) = 0x3feccccccccccccd;
      }
      kinmem_local._4_4_ = 0;
    }
    else {
      KINProcessError((KINMem)0x0,-2,"KINSOL","KINSetResMonParams","scalars < 0 illegal.");
      kinmem_local._4_4_ = -2;
    }
  }
  else {
    KINProcessError((KINMem)0x0,-2,"KINSOL","KINSetResMonParams","scalars < 0 illegal.");
    kinmem_local._4_4_ = -2;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINSetResMonParams(void *kinmem, realtype omegamin, realtype omegamax)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetResMonParams", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  /* check omegamin */

  if (omegamin < ZERO) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetResMonParams", MSG_BAD_OMEGA);
    return(KIN_ILL_INPUT);
  }

  if (omegamin == ZERO) 
    kin_mem->kin_omega_min = OMEGA_MIN;
  else
    kin_mem->kin_omega_min = omegamin;

  /* check omegamax */

  if (omegamax < ZERO) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetResMonParams", MSG_BAD_OMEGA);
    return(KIN_ILL_INPUT);
  }

  if (omegamax == ZERO) {

    if (kin_mem->kin_omega_min > OMEGA_MAX) {
      KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetResMonParams", MSG_BAD_OMEGA);
      return(KIN_ILL_INPUT);
    }
    else kin_mem->kin_omega_max = OMEGA_MAX;

  } else {

    if (kin_mem->kin_omega_min > omegamax) {
      KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetResMonParams", MSG_BAD_OMEGA);
      return(KIN_ILL_INPUT);
    }
    else kin_mem->kin_omega_max = omegamax;

  }

  return(KIN_SUCCESS);
}